

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O0

float Am_Clip_And_Map(float val,float val_1,float val_2,float target_val_1,float target_val_2)

{
  float target_val_2_local;
  float target_val_1_local;
  float val_2_local;
  float val_1_local;
  float val_local;
  
  if ((val_1 != val_2) || (NAN(val_1) || NAN(val_2))) {
    if (((((val_1 <= val) || (val_1_local = target_val_1, val_2 <= val_1)) &&
         ((val_2 <= val_1 || (val_1_local = target_val_2, val <= val_2)))) &&
        ((val_2 <= val || (val_1_local = target_val_2, val_1 <= val_2)))) &&
       ((val_1 <= val_2 || (val_1_local = target_val_1, val <= val_1)))) {
      val_1_local = target_val_1 + ((val - val_1) * (target_val_2 - target_val_1)) / (val_2 - val_1)
      ;
    }
  }
  else {
    val_1_local = target_val_2;
    if (val < val_1) {
      val_1_local = target_val_1;
    }
  }
  return val_1_local;
}

Assistant:

float
Am_Clip_And_Map(float val, float val_1, float val_2, float target_val_1,
                float target_val_2)
{
  if (val_1 == val_2) {
    if (val < val_1)
      return target_val_1;
    else
      return target_val_2;
  } else { // val_1 != val_2
    if (val < val_1 && val_1 < val_2)
      return target_val_1;
    else if (val_1 < val_2 && val_2 < val)
      return target_val_2;
    else if (val < val_2 && val_2 < val_1)
      return target_val_2;
    else if (val_2 < val_1 && val_1 < val)
      return target_val_1;
    else
      return target_val_1 +
             ((val - val_1) * (target_val_2 - target_val_1) / (val_2 - val_1));
  }
}